

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O3

void __thiscall
polyscope::render::backend_openGL_mock::MockGLEngine::createSlicePlaneFliterRule
          (MockGLEngine *this,string *uniquePostfix)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  pointer pcVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  pointer pSVar13;
  __hashtable *__h;
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  ShaderReplacementRule local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  undefined1 local_d0 [48];
  undefined1 auStack_a0 [24];
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  vStack_88;
  string local_70;
  string local_50;
  undefined1 auVar17 [64];
  
  std::operator+(&local_1b0,"SLICE_PLANE_CULL_",uniquePostfix);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar7 = (uniquePostfix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar7,pcVar7 + uniquePostfix->_M_string_length);
  backend_openGL3_glfw::generateSlicePlaneRule(&local_190,&local_70);
  pSVar13 = local_190.attributes.
            super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_108 = local_1b0._M_string_length;
  local_110 = &local_100;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p == &local_1b0.field_2) {
    local_100._8_8_ = local_1b0.field_2._8_8_;
  }
  else {
    local_110 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0._M_dataplus._M_p;
  }
  local_f0 = &local_e0;
  paVar1 = &local_190.ruleName.field_2;
  local_1b0._M_string_length = 0;
  local_1b0.field_2._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.ruleName._M_dataplus._M_p == paVar1) {
    local_e0._8_8_ = local_190.ruleName.field_2._8_8_;
  }
  else {
    local_f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_190.ruleName._M_dataplus._M_p;
  }
  auVar14 = vpmovsxbq_avx512f(ZEXT816(0x908020100));
  local_e8 = local_190.ruleName._M_string_length;
  local_190.ruleName._M_string_length = 0;
  local_190.ruleName.field_2._M_local_buf[0] = '\0';
  auVar15._8_8_ =
       local_190.replacements.
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  auVar15._0_8_ =
       local_190.replacements.
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  auVar15._16_8_ =
       local_190.replacements.
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  auVar15._24_8_ =
       local_190.uniforms.
       super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
       ._M_impl.super__Vector_impl_data._M_start;
  auVar15._32_8_ =
       local_190.uniforms.
       super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  auVar15._40_8_ =
       local_190.uniforms.
       super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  auVar15._48_8_ =
       local_190.attributes.
       super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
       ._M_impl.super__Vector_impl_data._M_start;
  auVar15._56_8_ =
       local_190.attributes.
       super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  auVar15 = vmovdqu64_avx512f(auVar15);
  local_190.replacements.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_190.replacements.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_190.replacements.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  auVar16 = vpbroadcastq_avx512f(auVar3);
  auVar17._0_16_ = auVar15._0_16_;
  auVar17._16_8_ = auVar16._16_8_;
  auVar17._24_8_ = auVar15._24_8_;
  auVar17._32_8_ = auVar15._32_8_;
  auVar17._40_8_ = auVar15._40_8_;
  auVar17._48_8_ = auVar15._48_8_;
  auVar17._56_8_ = auVar15._56_8_;
  local_190.replacements.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar16._8_8_ =
       local_190.uniforms.
       super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  auVar16._0_8_ =
       local_190.uniforms.
       super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
       ._M_impl.super__Vector_impl_data._M_start;
  auVar16._16_8_ =
       local_190.uniforms.
       super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  auVar16._24_8_ =
       local_190.attributes.
       super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
       ._M_impl.super__Vector_impl_data._M_start;
  auVar16._32_8_ =
       local_190.attributes.
       super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  auVar16._40_8_ =
       local_190.attributes.
       super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  auVar16._48_8_ =
       local_190.textures.
       super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
       ._M_impl.super__Vector_impl_data._M_start;
  auVar16._56_8_ =
       local_190.textures.
       super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  auVar15 = vpermt2q_avx512f(auVar17,auVar14,auVar16);
  local_190.uniforms.
  super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_190.uniforms.
  super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_190.uniforms.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  auVar16 = vpbroadcastq_avx512f(auVar4);
  auVar14._0_40_ = auVar15._0_40_;
  auVar14._40_8_ = auVar16._40_8_;
  auVar14._48_8_ = auVar15._48_8_;
  auVar14._56_8_ = auVar15._56_8_;
  local_190.uniforms.
  super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar11._8_8_ =
       local_190.attributes.
       super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  auVar11._0_8_ =
       local_190.attributes.
       super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
       ._M_impl.super__Vector_impl_data._M_start;
  auVar15 = vinserti32x4_avx512f(auVar14,auVar11,3);
  _local_d0 = vmovdqu64_avx512f(auVar15);
  local_190.attributes.
  super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_190.attributes.
  super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_190.attributes.
  super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auVar8 = vpermpd_avx2(ZEXT1632(CONCAT88(local_190.textures.
                                          super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
                                          ._M_impl.super__Vector_impl_data._M_finish,
                                          local_190.textures.
                                          super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
                                          ._M_impl.super__Vector_impl_data._M_start)),0xd0);
  auVar8 = vblendps_avx(auVar8,ZEXT832(pSVar13),3);
  auVar20._8_8_ =
       local_190.textures.
       super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  auVar20._0_8_ =
       local_190.textures.
       super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  auVar20._16_8_ =
       local_190.textures.
       super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  auVar20._24_8_ =
       local_190.textures.
       super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_190.textures.
  super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_190.textures.
  super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_190.textures.
  super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  unique0x000ebc80 = vblendps_avx(auVar8,auVar20,0xc0);
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  local_190.ruleName._M_dataplus._M_p = (pointer)paVar1;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->registeredShaderRules);
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector(&vStack_88);
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)(local_d0 + 0x30));
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
             *)(local_d0 + 0x18));
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_d0);
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector(&local_190.textures);
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector(&local_190.attributes);
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_190.uniforms);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_190.replacements);
  paVar1 = &local_190.ruleName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.ruleName._M_dataplus._M_p != paVar1) {
    operator_delete(local_190.ruleName._M_dataplus._M_p);
  }
  paVar2 = &local_1b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  std::operator+(&local_1b0,"SLICE_PLANE_VOLUMEGRID_CULL_",uniquePostfix);
  pcVar7 = (uniquePostfix->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar7,pcVar7 + uniquePostfix->_M_string_length);
  backend_openGL3_glfw::generateVolumeGridSlicePlaneRule(&local_190,&local_50);
  pSVar13 = local_190.attributes.
            super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_108 = local_1b0._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p == paVar2) {
    local_100._8_8_ = local_1b0.field_2._8_8_;
    local_110 = &local_100;
  }
  else {
    local_110 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0._M_dataplus._M_p;
  }
  local_100._M_allocated_capacity._1_7_ = local_1b0.field_2._M_allocated_capacity._1_7_;
  local_100._M_local_buf[0] = local_1b0.field_2._M_local_buf[0];
  local_1b0._M_string_length = 0;
  local_1b0.field_2._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.ruleName._M_dataplus._M_p == paVar1) {
    local_e0._8_8_ = local_190.ruleName.field_2._8_8_;
    local_f0 = &local_e0;
  }
  else {
    local_f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_190.ruleName._M_dataplus._M_p;
  }
  local_e0._M_allocated_capacity._1_7_ = local_190.ruleName.field_2._M_allocated_capacity._1_7_;
  local_e0._M_local_buf[0] = local_190.ruleName.field_2._M_local_buf[0];
  auVar15 = vpmovsxbq_avx512f(ZEXT816(0x908020100));
  local_e8 = local_190.ruleName._M_string_length;
  local_190.ruleName._M_string_length = 0;
  local_190.ruleName.field_2._M_local_buf[0] = '\0';
  auVar9._8_8_ = local_190.replacements.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auVar9._0_8_ = local_190.replacements.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  auVar9._16_8_ =
       local_190.replacements.
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  auVar9._24_8_ =
       local_190.uniforms.
       super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
       ._M_impl.super__Vector_impl_data._M_start;
  auVar9._32_8_ =
       local_190.uniforms.
       super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  auVar9._40_8_ =
       local_190.uniforms.
       super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  auVar9._48_8_ =
       local_190.attributes.
       super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
       ._M_impl.super__Vector_impl_data._M_start;
  auVar9._56_8_ =
       local_190.attributes.
       super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  auVar16 = vmovdqu64_avx512f(auVar9);
  local_190.replacements.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_190.replacements.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_190.replacements.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  auVar14 = vpbroadcastq_avx512f(auVar5);
  auVar18._0_16_ = auVar16._0_16_;
  auVar18._16_8_ = auVar14._16_8_;
  auVar18._24_8_ = auVar16._24_8_;
  auVar18._32_8_ = auVar16._32_8_;
  auVar18._40_8_ = auVar16._40_8_;
  auVar18._48_8_ = auVar16._48_8_;
  auVar18._56_8_ = auVar16._56_8_;
  local_190.replacements.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar10._8_8_ =
       local_190.uniforms.
       super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  auVar10._0_8_ =
       local_190.uniforms.
       super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
       ._M_impl.super__Vector_impl_data._M_start;
  auVar10._16_8_ =
       local_190.uniforms.
       super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  auVar10._24_8_ =
       local_190.attributes.
       super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
       ._M_impl.super__Vector_impl_data._M_start;
  auVar10._32_8_ =
       local_190.attributes.
       super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  auVar10._40_8_ =
       local_190.attributes.
       super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  auVar10._48_8_ =
       local_190.textures.
       super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
       ._M_impl.super__Vector_impl_data._M_start;
  auVar10._56_8_ =
       local_190.textures.
       super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  auVar15 = vpermt2q_avx512f(auVar18,auVar15,auVar10);
  local_190.uniforms.
  super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_190.uniforms.
  super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_190.uniforms.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  auVar16 = vpbroadcastq_avx512f(auVar6);
  auVar19._0_40_ = auVar15._0_40_;
  auVar19._40_8_ = auVar16._40_8_;
  auVar19._48_8_ = auVar15._48_8_;
  auVar19._56_8_ = auVar15._56_8_;
  local_190.uniforms.
  super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar12._8_8_ =
       local_190.attributes.
       super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  auVar12._0_8_ =
       local_190.attributes.
       super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
       ._M_impl.super__Vector_impl_data._M_start;
  auVar15 = vinserti32x4_avx512f(auVar19,auVar12,3);
  _local_d0 = vmovdqu64_avx512f(auVar15);
  local_190.attributes.
  super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_190.attributes.
  super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_190.attributes.
  super__Vector_base<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auVar8 = vpermpd_avx2(ZEXT1632(CONCAT88(local_190.textures.
                                          super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
                                          ._M_impl.super__Vector_impl_data._M_finish,
                                          local_190.textures.
                                          super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
                                          ._M_impl.super__Vector_impl_data._M_start)),0xd0);
  auVar8 = vblendps_avx(auVar8,ZEXT832(pSVar13),3);
  auVar21._8_8_ =
       local_190.textures.
       super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  auVar21._0_8_ =
       local_190.textures.
       super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  auVar21._16_8_ =
       local_190.textures.
       super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  auVar21._24_8_ =
       local_190.textures.
       super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_190.textures.
  super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_190.textures.
  super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_190.textures.
  super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  unique0x000ebc80 = vblendps_avx(auVar8,auVar21,0xc0);
  local_1b0._M_dataplus._M_p = (pointer)paVar2;
  local_190.ruleName._M_dataplus._M_p = (pointer)paVar1;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->registeredShaderRules);
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector(&vStack_88);
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)(local_d0 + 0x30));
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
             *)(local_d0 + 0x18));
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_d0);
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector(&local_190.textures);
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector(&local_190.attributes);
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_190.uniforms);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_190.replacements);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.ruleName._M_dataplus._M_p != &local_190.ruleName.field_2) {
    operator_delete(local_190.ruleName._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void MockGLEngine::createSlicePlaneFliterRule(std::string uniquePostfix) {
  using namespace backend_openGL3_glfw;
  registeredShaderRules.insert({"SLICE_PLANE_CULL_" + uniquePostfix, generateSlicePlaneRule(uniquePostfix)});
  registeredShaderRules.insert(
      {"SLICE_PLANE_VOLUMEGRID_CULL_" + uniquePostfix, generateVolumeGridSlicePlaneRule(uniquePostfix)});
}